

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O0

holder<cs::constant_values> * __thiscall
cs::
allocator_type<cs_impl::any::holder<cs::constant_values>,_64UL,_cs_impl::default_allocator_provider>
::alloc<cs::constant_values>
          (allocator_type<cs_impl::any::holder<cs::constant_values>,_64UL,_cs_impl::default_allocator_provider>
           *this,constant_values *args)

{
  long lVar1;
  __int_type _Var2;
  holder<cs::constant_values> *phVar3;
  new_allocator<cs_impl::any::holder<cs::constant_values>_> *in_RSI;
  new_allocator<cs_impl::any::holder<cs::constant_values>_> *in_RDI;
  holder<cs::constant_values> *ptr;
  holder<cs::constant_values> *in_stack_ffffffffffffffd8;
  size_type __n;
  
  __n = 0;
  if (*(long *)(in_RDI + 0x208) != 0) {
    _Var2 = std::__atomic_base::operator_cast_to_unsigned_long((__atomic_base<unsigned_long> *)0x0);
    if (_Var2 == 0) {
      lVar1 = *(long *)(in_RDI + 0x208);
      *(long *)(in_RDI + 0x208) = lVar1 + -1;
      phVar3 = *(holder<cs::constant_values> **)(in_RDI + lVar1 * 8 + -8);
      goto LAB_00585452;
    }
  }
  phVar3 = __gnu_cxx::new_allocator<cs_impl::any::holder<cs::constant_values>_>::allocate
                     (in_RSI,__n,in_RDI);
LAB_00585452:
  __gnu_cxx::new_allocator<cs_impl::any::holder<cs::constant_values>>::
  construct<cs_impl::any::holder<cs::constant_values>,cs::constant_values>
            (in_RDI,in_stack_ffffffffffffffd8,(constant_values *)0x58546d);
  return phVar3;
}

Assistant:

inline T *alloc(ArgsT &&...args)
		{
			T *ptr = nullptr;
			if (mOffset > 0 && global_thread_counter == 0)
				ptr = mPool[--mOffset];
			else
				ptr = mAlloc.allocate(1);
			mAlloc.construct(ptr, std::forward<ArgsT>(args)...);
			return ptr;
		}